

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O2

void add_combine_accum_help(int x,int *accum)

{
  int iVar1;
  int iVar2;
  
  if (x == 0x7ffffffe) {
    return;
  }
  if (x == 0x7fffffff) {
    iVar2 = 0x7fffffff;
    if (*accum != 0x7ffffffe) {
      return;
    }
  }
  else {
    iVar1 = *accum;
    iVar2 = x;
    if (iVar1 < 0x7ffffffe) {
      if (x < 1) {
        if (-1 < x) {
          return;
        }
        iVar2 = x + iVar1;
        if (iVar1 < -0x80000000 - x) {
          iVar2 = -0x80000000;
        }
      }
      else {
        iVar2 = x + iVar1;
        if (0x7ffffffd - x < iVar1) {
          iVar2 = 0x7ffffffd;
        }
      }
    }
  }
  *accum = iVar2;
  return;
}

Assistant:

static void add_combine_accum_help(int x, int *accum)
{
	if (x == UI_ENTRY_VALUE_NOT_PRESENT) {
		return;
	}
	if (x == UI_ENTRY_UNKNOWN_VALUE) {
		if (*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			*accum = UI_ENTRY_UNKNOWN_VALUE;
		}
		return;
	}
	if (*accum == UI_ENTRY_UNKNOWN_VALUE ||
		*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
		*accum = x;
		return;
	}
	/*
	 * Just in case, guard against overflow or underflow.  Also guard
	 * adding up to the special values which are equal to INT_MAX and
	 * INT_MAX - 1.
	 */
	if (x > 0) {
		if (*accum <= INT_MAX - 2 - x) {
			*accum += x;
		} else {
			*accum = INT_MAX - 2;
		}
	} else if (x < 0) {
		if (*accum >= INT_MIN - x) {
			*accum += x;
		} else {
			*accum = INT_MIN;
		}
	}
}